

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_generic_section.hpp
# Opt level: O3

error_code __thiscall
pstore::exchange::import_ns::
generic_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
::key(generic_section<std::back_insert_iterator<std::vector<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>,_std::allocator<std::unique_ptr<pstore::repo::section_creation_dispatcher,_std::default_delete<pstore::repo::section_creation_dispatcher>_>_>_>_>_>
      *this,string *k)

{
  int iVar1;
  error_code eVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)k);
  if (iVar1 == 0) {
    *(byte *)&(this->seen_).super__Base_bitset<1UL>._M_w =
         (byte)(this->seen_).super__Base_bitset<1UL>._M_w | 2;
    eVar2 = rule::push<pstore::exchange::import_ns::string_rule,std::__cxx11::string*>
                      (&this->super_rule,&this->data_);
    return eVar2;
  }
  iVar1 = std::__cxx11::string::compare((char *)k);
  if (iVar1 == 0) {
    *(byte *)&(this->seen_).super__Base_bitset<1UL>._M_w =
         (byte)(this->seen_).super__Base_bitset<1UL>._M_w | 1;
    eVar2 = rule::push<pstore::exchange::import_ns::uint64_rule,unsigned_long*>
                      (&this->super_rule,&this->align_);
    return eVar2;
  }
  iVar1 = std::__cxx11::string::compare((char *)k);
  if (iVar1 == 0) {
    *(byte *)&(this->seen_).super__Base_bitset<1UL>._M_w =
         (byte)(this->seen_).super__Base_bitset<1UL>._M_w | 4;
    eVar2 = rule::
            push<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::fixups_object<pstore::exchange::import_ns::internal_fixup,pstore::repo::internal_fixup>,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>*>,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,std::vector<pstore::repo::internal_fixup,std::allocator<pstore::repo::internal_fixup>>*>
                      (&this->super_rule,(this->names_).ptr_,&((this->content_).ptr_)->ifixups);
    return eVar2;
  }
  iVar1 = std::__cxx11::string::compare((char *)k);
  if (iVar1 != 0) {
    eVar2 = make_error_code(unrecognized_section_object_key);
    return eVar2;
  }
  *(byte *)&(this->seen_).super__Base_bitset<1UL>._M_w =
       (byte)(this->seen_).super__Base_bitset<1UL>._M_w | 8;
  eVar2 = rule::
          push<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::fixups_object<pstore::exchange::import_ns::external_fixup,pstore::repo::external_fixup>,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>*>,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,std::vector<pstore::repo::external_fixup,std::allocator<pstore::repo::external_fixup>>*>
                    (&this->super_rule,(this->names_).ptr_,&((this->content_).ptr_)->xfixups);
  return eVar2;
}

Assistant:

std::error_code generic_section<OutputIterator>::key (std::string const & k) {
                if (k == "data") {
                    seen_[data] = true; // string (ascii85)
                    return this->push<string_rule> (&data_);
                }
                if (k == "align") {
                    seen_[align] = true; // integer
                    return this->push<uint64_rule> (&align_);
                }
                if (k == "ifixups") {
                    seen_[ifixups] = true;
                    return push_array_rule<ifixups_object> (this, names_, &content_->ifixups);
                }
                if (k == "xfixups") {
                    seen_[xfixups] = true;
                    return push_array_rule<xfixups_object> (this, names_, &content_->xfixups);
                }
                return error::unrecognized_section_object_key;
            }